

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

void __thiscall bytearray_undo_rec::apply_undo(bytearray_undo_rec *this,CVmObjByteArray *arr)

{
  uint uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  bytearray_undo_bytes *pbVar4;
  ulong uVar5;
  ulong __n;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *__src;
  
  uVar6 = this->cnt_;
  if (uVar6 != 0) {
    uVar3 = this->idx_;
    pbVar4 = (bytearray_undo_bytes *)&this->save_head_;
    do {
      uVar7 = 0x8000;
      if (uVar6 < 0x8000) {
        uVar7 = uVar6;
      }
      pbVar4 = pbVar4->nxt_;
      __src = pbVar4->buf_;
      uVar2 = uVar3;
      uVar8 = uVar7;
      do {
        uVar1 = (uint)(uVar2 - 1);
        uVar5 = (ulong)(uVar1 & 0x7fff);
        __n = 0x8000 - uVar5;
        if (uVar8 <= __n) {
          __n = uVar8;
        }
        memcpy((void *)(uVar5 + *(long *)(*(long *)((arr->super_CVmObject).ext_ +
                                                   (uVar2 - 1 >> 0x1c) * 8 + 4) +
                                         (ulong)(uVar1 >> 0xc & 0xfff8))),__src,__n);
        __src = __src + __n;
        uVar2 = uVar2 + __n;
        uVar8 = uVar8 - __n;
      } while (uVar8 != 0);
      uVar3 = uVar3 + uVar7;
      uVar6 = uVar6 - uVar7;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void apply_undo(CVmObjByteArray *arr)
    {
        bytearray_undo_bytes *cur;
        unsigned long idx;
        unsigned long rem;

        /* delete our list of saved byte blocks */
        for (cur = save_head_, idx = idx_, rem = cnt_ ; rem != 0 ; )
        {
            size_t copy_len;
            
            /* limit the copy to our block size (32k) */
            copy_len = 32768;
            if (copy_len > rem)
                copy_len = (size_t)rem;

            /* copy this block into the array */
            arr->copy_from_buf(cur->buf_, idx, copy_len);

            /* move past the copied data */
            cur = cur->nxt_;
            idx += copy_len;
            rem -= copy_len;
        }
    }